

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O1

void Fx_PrintStats(Fx_Man_t *p,abctime clk)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  
  lVar1 = (long)p->vCubes->nSize;
  uVar3 = 0;
  uVar4 = 0;
  if (0 < lVar1) {
    lVar2 = 0;
    uVar4 = 0;
    do {
      uVar4 = (ulong)((int)uVar4 + (uint)(0 < *(int *)((long)&p->vCubes->pArray->nSize + lVar2)));
      lVar2 = lVar2 + 0x10;
    } while (lVar1 * 0x10 != lVar2);
  }
  printf("Cubes =%8d  ",uVar4);
  lVar1 = (long)p->vLits->nSize;
  if (0 < lVar1) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      uVar3 = uVar3 + (0 < *(int *)((long)&p->vLits->pArray->nSize + lVar2));
      lVar2 = lVar2 + 0x10;
    } while (lVar1 * 0x10 != lVar2);
  }
  printf("Lits  =%8d  ",(ulong)uVar3);
  printf("Divs  =%8d  ",(ulong)(uint)p->pHash->vMap->nSize);
  iVar5 = p->vPrio->nSize;
  if (0 < iVar5) {
    printf("Divs+ =%8d  ",(ulong)(iVar5 - 1));
    printf("Compl =%8d  ",(ulong)(uint)p->nDivMux[1]);
    iVar5 = 0x81dbf2;
    printf("Extr  =%7d  ",(ulong)(uint)p->nDivs);
    Abc_Print(iVar5,"%s =","Time");
    Abc_Print(iVar5,"%9.2f sec\n",(double)clk / 1000000.0);
    return;
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecQue.h"
                ,0x88,"int Vec_QueSize(Vec_Que_t *)");
}

Assistant:

static void Fx_PrintStats( Fx_Man_t * p, abctime clk )
{
    printf( "Cubes =%8d  ", Vec_WecSizeUsed(p->vCubes) );
    printf( "Lits  =%8d  ", Vec_WecSizeUsed(p->vLits) );
    printf( "Divs  =%8d  ", Hsh_VecSize(p->pHash) );
    printf( "Divs+ =%8d  ", Vec_QueSize(p->vPrio) );
    printf( "Compl =%8d  ", p->nDivMux[1] );
    printf( "Extr  =%7d  ", p->nDivs );
//    printf( "DivsS =%6d  ", p->nDivsS );
//    printf( "PairS =%6d  ", p->nPairsS );
//    printf( "PairD =%6d  ", p->nPairsD );
    Abc_PrintTime( 1, "Time", clk );
//    printf( "\n" );
}